

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

StringResult<long_long> __thiscall
QCborStreamReaderPrivate::readStringChunk(QCborStreamReaderPrivate *this,ReadStringChunk params)

{
  size_type *psVar1;
  QByteArray *this_00;
  uint8_t *puVar2;
  QCborStreamReaderPrivate *this_01;
  long *plVar3;
  long alloc;
  Data *pDVar4;
  char *__dest;
  bool bVar5;
  Code CVar6;
  Code CVar7;
  long lVar8;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  __off_t extraout_RDX_02;
  __off_t __length;
  undefined1 *puVar9;
  undefined8 uVar10;
  char *__file;
  undefined1 *puVar11;
  undefined1 *puVar12;
  long in_FS_OFFSET;
  ReadStringChunk params_00;
  ReadStringChunk params_01;
  StringResult<long_long> SVar13;
  QByteArrayView s;
  size_t len;
  undefined1 *local_48;
  undefined1 *local_40;
  long local_38;
  
  params_00.field_0 = params.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  (this->lastError).c = NoError;
  ensureStringIteration(this);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  CVar6 = get_string_chunk_size(&this->currentElement,(size_t *)&local_40,(size_t *)&local_48);
  puVar9 = local_40;
  puVar11 = local_48;
  if ((CVar6 == NoError) && (CVar6 = DataTooLarge, -1 < (long)local_48)) {
    puVar12 = local_40 + (long)local_48;
    if (SCARRY8((long)local_40,(long)local_48)) goto LAB_0049c5b7;
    plVar3 = (long *)(this->currentElement).source.ptr;
    if ((long *)*plVar3 == (long *)0x0) {
      lVar8 = plVar3[3];
    }
    else {
      lVar8 = (**(code **)(*(long *)*plVar3 + 0xa0))();
    }
    CVar6 = EndOfFile;
    if ((long)puVar12 <= lVar8 - plVar3[0xd]) {
      puVar2 = &(this->currentElement).flags;
      *puVar2 = *puVar2 & 0xfb;
      CVar6 = NoError;
    }
  }
  else {
LAB_0049c5b7:
    puVar9 = (undefined1 *)0x0;
  }
  CVar7 = DataTooLarge;
  if (-1 < (long)puVar11) {
    CVar7 = CVar6;
  }
  if (CVar6 != NoError) {
    CVar7 = CVar6;
  }
  if (CVar7 != NoError) {
    uVar10 = 0xffffffff;
    if (CVar7 == (IllegalSimpleType|UnknownError)) {
      preread(this);
      if (((this->currentElement).flags & 0x10) != 0) {
        this_01 = (QCborStreamReaderPrivate *)(this->currentElement).source.ptr;
        psVar1 = &this_01->bufferStart;
        *psVar1 = *psVar1 + 1;
        preread(this_01);
      }
      CVar7 = preparse_next_value(&this->currentElement);
      uVar10 = 0;
    }
    if (CVar7 == NoError) {
      lVar8 = 0;
    }
    else {
      if (CVar7 != EndOfFile) {
        this->corrupt = true;
      }
      (this->lastError).c = CVar7;
      lVar8 = 0;
    }
    goto LAB_0049c7b5;
  }
  lVar8 = this->bufferStart;
  this->bufferStart = (size_type)(puVar9 + lVar8);
  if (this->device != (QIODevice *)0x0) {
    QIODevice::skip(this->device,(qint64)(puVar9 + lVar8));
  }
  if (params.maxlen_or_type == -5) {
    params_01.maxlen_or_type = -5;
    params_01.field_0.ptr = params_00.field_0.ptr;
    lVar8 = readStringChunk_byte(this,params_01,(qsizetype)puVar11);
    uVar10 = 0xffffffff;
    if (lVar8 < 0) goto LAB_0049c7b5;
    s.m_data = ((params_00.field_0.array)->d).ptr + (((params_00.field_0.array)->d).size - lVar8);
    s.m_size = lVar8;
    bVar5 = QtPrivate::isValidUtf8(s);
    __length = extraout_RDX_00;
    if (!bVar5) {
      this->corrupt = true;
      (this->lastError).c = InvalidUtf8String;
      lVar8 = -1;
      goto LAB_0049c7b5;
    }
  }
  else {
    if (params.maxlen_or_type == -3) {
      params_00.maxlen_or_type = -3;
      lVar8 = readStringChunk_unicode(this,params_00,(qsizetype)puVar11);
      __length = extraout_RDX;
    }
    else {
      lVar8 = readStringChunk_byte(this,params,(qsizetype)puVar11);
      __length = extraout_RDX_01;
    }
    if (lVar8 < 0) {
      uVar10 = 0xffffffff;
      goto LAB_0049c7b5;
    }
  }
  puVar11 = puVar11 + this->bufferStart;
  this->bufferStart = (size_type)puVar11;
  if (this->device != (QIODevice *)0x0) {
    this_00 = &this->buffer;
    alloc = (this->buffer).d.size;
    __file = (char *)(alloc - (long)puVar11);
    if (__file == (char *)0x0 || alloc < (long)puVar11) {
      __file = (char *)0x0;
    }
    else {
      pDVar4 = (this_00->d).d;
      if ((pDVar4 == (Data *)0x0) ||
         (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(this_00,alloc,KeepSize);
        puVar11 = (undefined1 *)this->bufferStart;
      }
      __dest = (this->buffer).d.ptr;
      memmove(__dest,__dest + (long)puVar11,(size_t)__file);
      __length = extraout_RDX_02;
    }
    QByteArray::truncate(this_00,__file,__length);
    this->bufferStart = 0;
  }
  preread(this);
  uVar10 = 1;
LAB_0049c7b5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    SVar13._8_8_ = uVar10;
    SVar13.data = lVar8;
    return SVar13;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE QCborStreamReader::StringResult<qsizetype>
QCborStreamReaderPrivate::readStringChunk(ReadStringChunk params)
{
    CborError err;
    size_t len;
    const void *content = nullptr;
    QCborStreamReader::StringResult<qsizetype> result;
    result.data = 0;
    result.status = QCborStreamReader::Error;

    lastError = {};
    if (!ensureStringIteration())
        return result;

    // Note: in the current implementation, the call into TinyCBOR below only
    // succeeds if we *already* have all the data in memory. That's obvious for
    // the case of direct memory (no QIODevice), whereas for QIODevices
    // qt_cbor_decoder_transfer_string() enforces that
    // QIODevice::bytesAvailable() be bigger than the amount we're about to
    // read.
    //
    // This is an important security gate: if the CBOR stream is corrupt or
    // malicious, and has an impossibly large string size, we only go past it
    // if the transfer to the destination buffer will succeed (modulo QIODevice
    // I/O failures).

#if 1
    // Using internal TinyCBOR API!
    err = _cbor_value_get_string_chunk(&currentElement, &content, &len, &currentElement);
#else
    // the above is effectively the same as:
    if (cbor_value_is_byte_string(&currentElement))
        err = cbor_value_get_byte_string_chunk(&currentElement, reinterpret_cast<const uint8_t **>(&content),
                                               &len, &currentElement);
    else
        err = cbor_value_get_text_string_chunk(&currentElement, reinterpret_cast<const char **>(&content),
                                               &len, &currentElement);
#endif

    // Range check: using implementation-defined behavior in converting an
    // unsigned value out of range of the destination signed type (same as
    // "len > size_t(std::numeric_limits<qsizetype>::max())", but generates
    // better code with ICC and MSVC).
    if (!err && qsizetype(len) < 0)
        err = CborErrorDataTooLarge;

    if (err) {
        if (err == CborErrorNoMoreStringChunks) {
            preread();
            err = cbor_value_finish_string_iteration(&currentElement);
            result.status = QCborStreamReader::EndOfString;
        }
        if (err)
            handleError(err);
        // caller musts call preparse()
        return result;
    }

    qptrdiff offset = qptrdiff(content);
    bufferStart += offset;
    if (device) {
        // This first skip can't fail because we've already read this many bytes.
        device->skip(bufferStart);
    }

    if (params.isString()) {
        // readString()
        result.data = readStringChunk_unicode(params, qsizetype(len));
    } else if (params.isUtf8String()) {
        result.data = readStringChunk_utf8(params, qsizetype(len));
    } else {
        // readByteArray() or readStringChunk()
        result.data = readStringChunk_byte(params, qsizetype(len));
    }

    if (result.data < 0)
        return result;      // error

    // adjust the buffers after we're done reading the string
    bufferStart += len;
    if (device) {
        qsizetype remainingInBuffer = buffer.size() - bufferStart;

        if (remainingInBuffer <= 0) {
            // We've read from the QIODevice more than what was in the buffer.
            buffer.truncate(0);
        } else {
            // There's still data buffered, but we need to move it around.
            char *ptr = buffer.data();
            memmove(ptr, ptr + bufferStart, remainingInBuffer);
            buffer.truncate(remainingInBuffer);
        }

        bufferStart = 0;
    }

    preread();
    result.status = QCborStreamReader::Ok;
    return result;
}